

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bf_crc.hpp
# Opt level: O0

void __thiscall bf_crc::set_crc_width(bf_crc *this,uint16_t var)

{
  uint32_t uVar1;
  undefined2 in_SI;
  undefined2 *in_RDI;
  undefined6 in_stack_fffffffffffffff0;
  
  *in_RDI = in_SI;
  update_test_vector_count((bf_crc *)CONCAT26(in_SI,in_stack_fffffffffffffff0));
  *(undefined1 *)(in_RDI + 4) = 0;
  *(undefined4 *)(in_RDI + 6) = 0;
  uVar1 = max_value((uint8_t)*in_RDI);
  *(uint32_t *)(in_RDI + 8) = uVar1;
  update_test_vector_count((bf_crc *)CONCAT26(in_SI,in_stack_fffffffffffffff0));
  return;
}

Assistant:

void set_crc_width(uint16_t var) { 
			crc_width_ = var; 
			update_test_vector_count(); 
			polynomial_range_ = false;
			polynomial_start_ = 0;
			polynomial_end_ = max_value(crc_width_);
			update_test_vector_count();
		}